

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom(EpsCopyInputStream *this,StringPiece flat)

{
  size_type sVar1;
  const_pointer pcVar2;
  EpsCopyInputStream *this_local;
  StringPiece flat_local;
  
  flat_local.ptr_ = (char *)flat.length_;
  this_local = (EpsCopyInputStream *)flat.ptr_;
  this->overall_limit_ = 0;
  sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)&this_local);
  if (sVar1 < 0x11) {
    pcVar2 = stringpiece_internal::StringPiece::data((StringPiece *)&this_local);
    sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)&this_local);
    memcpy(this->buffer_,pcVar2,sVar1);
    this->limit_ = 0;
    sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)&this_local);
    this->buffer_end_ = this->buffer_ + sVar1;
    this->limit_end_ = this->buffer_ + sVar1;
    this->next_chunk_ = (char *)0x0;
    if (this->aliasing_ == 1) {
      pcVar2 = stringpiece_internal::StringPiece::data((StringPiece *)&this_local);
      this->aliasing_ = (long)pcVar2 - (long)this->buffer_;
    }
    flat_local.length_ = (size_type)this->buffer_;
  }
  else {
    this->limit_ = 0x10;
    pcVar2 = stringpiece_internal::StringPiece::data((StringPiece *)&this_local);
    sVar1 = stringpiece_internal::StringPiece::size((StringPiece *)&this_local);
    this->buffer_end_ = pcVar2 + (sVar1 - 0x10);
    this->limit_end_ = pcVar2 + (sVar1 - 0x10);
    this->next_chunk_ = this->buffer_;
    if (this->aliasing_ == 1) {
      this->aliasing_ = 2;
    }
    flat_local.length_ =
         (size_type)stringpiece_internal::StringPiece::data((StringPiece *)&this_local);
  }
  return (char *)flat_local.length_;
}

Assistant:

const char* InitFrom(StringPiece flat) {
    overall_limit_ = 0;
    if (flat.size() > kSlopBytes) {
      limit_ = kSlopBytes;
      limit_end_ = buffer_end_ = flat.data() + flat.size() - kSlopBytes;
      next_chunk_ = buffer_;
      if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
      return flat.data();
    } else {
      std::memcpy(buffer_, flat.data(), flat.size());
      limit_ = 0;
      limit_end_ = buffer_end_ = buffer_ + flat.size();
      next_chunk_ = nullptr;
      if (aliasing_ == kOnPatch) {
        aliasing_ = reinterpret_cast<std::uintptr_t>(flat.data()) -
                    reinterpret_cast<std::uintptr_t>(buffer_);
      }
      return buffer_;
    }
  }